

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

bool __thiscall Tokenizer::processElement(Tokenizer *this,iterator *it)

{
  pointer pRVar1;
  const_iterator __position;
  pointer pTVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  pointer pvVar6;
  bool bVar7;
  pointer this_00;
  _List_node_base *p_Var8;
  Tokenizer *pTVar9;
  size_t *other;
  pointer pTVar10;
  Tokenizer *pTVar11;
  Token originalToken;
  size_t index;
  undefined1 local_b8 [64];
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Tokenizer *local_58;
  const_iterator local_50;
  SymbolTable *local_48;
  size_t local_40;
  anon_class_8_1_8991fb9c local_38;
  
  pTVar9 = (Tokenizer *)it->_M_node;
  if ((pTVar9 != this) && (*(char *)((long)&(pTVar9->invalidToken).line + 4) == '\0')) {
    local_48 = &Global.symbolTable;
    pTVar11 = pTVar9;
    local_58 = pTVar9;
    do {
      if ((int)(pTVar11->invalidToken).line == 1) {
        if (*(undefined1 *)
             ((long)&(pTVar11->invalidToken).value.
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x10) != '\x04') {
LAB_0014b1f6:
          __assert_fail("std::holds_alternative<Identifier>(value)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                        ,0x4d,"const Identifier &Token::identifierValue() const");
        }
        other = &(pTVar11->invalidToken).column;
        pRVar1 = (this->replacements).
                 super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (this->replacements).
                       super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1;
            this_00 = this_00 + 1) {
          bVar7 = Identifier::operator==(&this_00->identifier,(Identifier *)other);
          if (bVar7) {
            p_Var8 = it->_M_node;
            local_50._M_node = p_Var8->_M_next;
            pTVar10 = (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar3 = *(undefined4 *)((long)&pTVar10->line + 4);
            sVar5 = pTVar10->column;
            uVar4 = *(undefined4 *)((long)&pTVar10->column + 4);
            *(int *)&p_Var8[1]._M_next = (int)pTVar10->line;
            *(undefined4 *)((long)&p_Var8[1]._M_next + 4) = uVar3;
            *(int *)&p_Var8[1]._M_prev = (int)sVar5;
            *(undefined4 *)((long)&p_Var8[1]._M_prev + 4) = uVar4;
            *(undefined8 *)((long)&p_Var8[1]._M_prev + 5) =
                 *(undefined8 *)((long)&pTVar10->column + 5);
            local_b8._0_8_ = &p_Var8[2]._M_prev;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
              ::_S_vtable._M_arr
              [(long)(char)*(__index_type *)
                            ((long)&(pTVar10->value).
                                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            + 0x20) + 1]._M_data)
                      ((anon_class_8_1_8991fb9c *)local_b8,&pTVar10->value);
            pTVar9 = local_58;
            std::__cxx11::string::_M_assign((string *)(p_Var8 + 5));
            std::__cxx11::list<Token,std::allocator<Token>>::
            insert<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,void>
                      ((list<Token,std::allocator<Token>> *)this,local_50,
                       (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,
                       (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            p_Var8 = it->_M_node;
            if (*(int *)&p_Var8[2]._M_next != 1) goto LAB_0014b1d0;
            if (*(char *)&p_Var8[4]._M_prev != '\x04') goto LAB_0014b1f6;
            bVar7 = Identifier::operator!=((Identifier *)other,(Identifier *)&p_Var8[2]._M_prev);
            if (bVar7) goto LAB_0014b1d0;
            break;
          }
        }
        bVar7 = SymbolTable::findEquation
                          (local_48,(Identifier *)other,Global.FileInfo.FileNum,Global.Section,
                           &local_40);
        sVar5 = local_40;
        pvVar6 = equValues.
                 super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (!bVar7) {
          pTVar11 = (Tokenizer *)it->_M_node;
          goto LAB_0014b1cb;
        }
        __position._M_node = it->_M_node->_M_next;
        if (((Tokenizer *)__position._M_node != this) &&
           (*(int *)&__position._M_node[2]._M_next == 0x21)) break;
        sStack_70 = 0;
        local_68._8_8_ = 0;
        local_b8._48_8_ = 0;
        local_b8._56_8_ = 0;
        local_b8._32_8_ = 0;
        local_b8._40_8_ = 0;
        local_b8._16_4_ = Invalid;
        local_b8[0x14] = false;
        local_b8._21_3_ = 0;
        local_b8._24_8_ = 0;
        local_b8._0_8_ =
             (_Copy_assign_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
             0x0;
        local_b8._8_5_ = 0;
        local_b8._13_3_ = 0;
        local_68._M_allocated_capacity = 0;
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::list<Token,_std::allocator<Token>_>::insert
                  (&this->tokens,__position,
                   ((long)equValues.
                          super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_40].
                          super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)equValues.
                          super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_40].
                          super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 - 1,
                   (value_type *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                           *)(local_b8 + 0x18));
        p_Var8 = it->_M_node;
        local_b8._16_5_ = (undefined5)((ulong)*(undefined8 *)((long)&p_Var8[1]._M_prev + 5) >> 0x18)
        ;
        local_b8._0_8_ = p_Var8[1]._M_next;
        local_b8._8_5_ = SUB85(p_Var8[1]._M_prev,0);
        local_b8._13_3_ = (undefined3)((ulong)p_Var8[1]._M_prev >> 0x28);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_b8 + 0x18),
                        (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)&p_Var8[2]._M_prev);
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,p_Var8[5]._M_next,
                   (long)&(p_Var8[5]._M_prev)->_M_next + (long)p_Var8[5]._M_next);
        pTVar10 = pvVar6[sVar5].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar2 = pvVar6[sVar5].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pTVar10 != pTVar2) {
          p_Var8 = it->_M_node;
          do {
            *(undefined8 *)((long)&p_Var8[1]._M_prev + 5) =
                 *(undefined8 *)((long)&pTVar10->column + 5);
            uVar3 = *(undefined4 *)((long)&pTVar10->line + 4);
            sVar5 = pTVar10->column;
            uVar4 = *(undefined4 *)((long)&pTVar10->column + 4);
            *(int *)&p_Var8[1]._M_next = (int)pTVar10->line;
            *(undefined4 *)((long)&p_Var8[1]._M_next + 4) = uVar3;
            *(int *)&p_Var8[1]._M_prev = (int)sVar5;
            *(undefined4 *)((long)&p_Var8[1]._M_prev + 4) = uVar4;
            local_38.this =
                 (_Copy_assign_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                  *)&p_Var8[2]._M_prev;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
              ::_S_vtable._M_arr
              [(long)(char)*(__index_type *)
                            ((long)&(pTVar10->value).
                                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            + 0x20) + 1]._M_data)(&local_38,&pTVar10->value);
            std::__cxx11::string::_M_assign((string *)(p_Var8 + 5));
            p_Var8[1]._M_next = (_List_node_base *)local_b8._0_8_;
            p_Var8[1]._M_prev = (_List_node_base *)CONCAT35(local_b8._13_3_,local_b8._8_5_);
            p_Var8 = p_Var8->_M_next;
            pTVar10 = pTVar10 + 1;
          } while (pTVar10 != pTVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                           *)(local_b8 + 0x18));
      }
      else {
LAB_0014b1cb:
        *(undefined1 *)((long)&(pTVar11->invalidToken).line + 4) = 1;
      }
LAB_0014b1d0:
      pTVar11 = (Tokenizer *)it->_M_node;
    } while (*(char *)((long)&(pTVar11->invalidToken).line + 4) == '\0');
  }
  return pTVar9 != this;
}

Assistant:

bool Tokenizer::processElement(TokenList::iterator& it)
{
	if (it == tokens.end())
		return false;

	while (!(*it).checked)
	{
		bool replaced = false;
		if ((*it).type == TokenType::Identifier)
		{
			const Identifier &identifier = (*it).identifierValue();
			for (const Replacement& replacement: replacements)
			{
				// if the identifier matches, add all of its tokens
				if (replacement.identifier == identifier)
				{
					TokenList::iterator insertIt = it;
					++insertIt;
				
					// replace old token with the new tokens
					// replace the first token manually so that any iterators
					// are still guaranteed to be valid
					(*it) = replacement.value[0];
					tokens.insert(insertIt,replacement.value.begin()+1, replacement.value.end());

					// If the value at this position didn't change, then just keep going.
					// Otherwise we'd be stuck in an endless replace loop
					if ((*it).type != TokenType::Identifier || identifier != (*it).identifierValue())
						replaced = true;
					break;
				}
			}

			if (replaced)
				continue;

			// check for equs
			size_t index;
			if (Global.symbolTable.findEquation(identifier,Global.FileInfo.FileNum,Global.Section,index))
			{
				TokenList::iterator nextIt = it;
				std::advance(nextIt, 1);
			
				// check if this is another equ with the same name.
				// if so, keep equ redefinitions for later error handling
				if (nextIt != tokens.end() && nextIt->type == TokenType::Equ)
					break;

				// make room for the replacement tokens
				const std::vector<Token>& replacement = equValues[index];
				tokens.insert(nextIt, replacement.size()-1, {});

				// insert replacement tokens, while keeping the file info of the original token
				Token originalToken = *it;

				TokenList::iterator insertIt = it;
				for (const Token& token: replacement)
				{
					(*insertIt) = token;
					insertIt->line = originalToken.line;
					insertIt->column = originalToken.column;
					std::advance(insertIt, 1);
				}

				replaced = true;
				continue;
			}
		}

		if (!replaced)
			(*it).checked = true;
	}

	return true;
}